

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O2

void __thiscall
embree::TutorialApplication::motionFunc
          (TutorialApplication *this,GLFWwindow *window,double x,double y)

{
  int iVar1;
  ImGuiIO *pIVar2;
  float fVar3;
  float fVar4;
  
  ImGui_ImplGlfw_CursorPosCallback(window,x,y);
  pIVar2 = ImGui::GetIO();
  if (pIVar2->WantCaptureMouse == false) {
    fVar3 = (float)(this->clickX - x);
    fVar4 = (float)(this->clickY - y);
    this->clickX = x;
    this->clickY = y;
    iVar1 = this->mouseMode;
    if (iVar1 == 4) {
      Camera::rotate(&this->camera,fVar3 * -0.005,fVar4 * 0.005);
      return;
    }
    if (iVar1 == 3) {
      Camera::dolly(&this->camera,-fVar4);
      return;
    }
    if (iVar1 == 1) {
      Camera::rotateOrbit(&this->camera,fVar3 * -0.005,fVar4 * 0.005);
      return;
    }
  }
  return;
}

Assistant:

void TutorialApplication::motionFunc(GLFWwindow* window, double x, double y)
  {
    ImGui_ImplGlfw_CursorPosCallback(window, x, y);
    if (ImGui::GetIO().WantCaptureMouse) return;
  
    float dClickX = float(clickX - x), dClickY = float(clickY - y);
    clickX = x; clickY = y;

    switch (mouseMode) {
    case 1: camera.rotateOrbit(-0.005f*dClickX,0.005f*dClickY); break;
    case 2: break;
    case 3: camera.dolly(-dClickY); break;
    case 4: camera.rotate(-0.005f*dClickX,0.005f*dClickY); break;
    }
  }